

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Internal::disconnect_proof_tracer(Internal *this,Tracer *tracer)

{
  bool bVar1;
  iterator __position;
  Tracer *in_RSI;
  Proof *in_RDI;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  it;
  vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_> *in_stack_ffffffffffffffa8;
  Tracer **in_stack_ffffffffffffffb8;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  in_stack_ffffffffffffffc8;
  Proof *this_00;
  
  this_00 = in_RDI;
  std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::begin
            (in_stack_ffffffffffffffa8);
  std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::end(in_stack_ffffffffffffffa8)
  ;
  std::
  find<__gnu_cxx::__normal_iterator<CaDiCaL::Tracer**,std::vector<CaDiCaL::Tracer*,std::allocator<CaDiCaL::Tracer*>>>,CaDiCaL::Tracer*>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __position = std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::end
                         (in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
                      *)in_RDI,
                     (__normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
                      *)in_stack_ffffffffffffffa8);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Tracer*const*,std::vector<CaDiCaL::Tracer*,std::allocator<CaDiCaL::Tracer*>>>
    ::__normal_iterator<CaDiCaL::Tracer**>
              ((__normal_iterator<CaDiCaL::Tracer_*const_*,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
                *)in_RDI,
               (__normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
                *)&in_RDI[0x18].proof_chain.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::erase
              ((vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_> *)
               in_stack_ffffffffffffffc0._M_current,(const_iterator)__position._M_current);
    Proof::disconnect(this_00,in_RSI);
  }
  return bVar1;
}

Assistant:

bool Internal::disconnect_proof_tracer (Tracer *tracer) {
  auto it = std::find (tracers.begin (), tracers.end (), tracer);
  if (it != tracers.end ()) {
    tracers.erase (it);
    assert (proof);
    proof->disconnect (tracer);
    return true;
  }
  return false;
}